

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O1

void __thiscall
L15_4::LabeledSales::NBadIndex::NBadIndex(NBadIndex *this,string *lb,int ix,string *s)

{
  std::logic_error::logic_error((logic_error *)this,(string *)s);
  (this->super_BadIndex)._bad_value = ix;
  *(undefined ***)&this->super_BadIndex = &PTR__NBadIndex_00134b20;
  (this->_lbl)._M_dataplus._M_p = (pointer)&(this->_lbl).field_2;
  (this->_lbl)._M_string_length = 0;
  (this->_lbl).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_lbl);
  return;
}

Assistant:

LabeledSales::NBadIndex::NBadIndex(const std::string & lb, int ix, const std::string &s): Sales::BadIndex(ix, s) {
        _lbl = lb;
    }